

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<unsigned_char> * __thiscall kj::Array<char>::releaseAsBytes(Array<char> *this)

{
  ArrayDisposer *pAVar1;
  size_t sVar2;
  Array<unsigned_char> *result;
  Array<unsigned_char> *in_RDI;
  
  pAVar1 = this->disposer;
  if (pAVar1 != (ArrayDisposer *)0x0) {
    sVar2 = this->size_;
    in_RDI->ptr = (uchar *)this->ptr;
    in_RDI->size_ = sVar2;
    in_RDI->disposer = pAVar1;
    this->ptr = (char *)0x0;
    this->size_ = 0;
    return in_RDI;
  }
  in_RDI->ptr = (uchar *)0x0;
  in_RDI->size_ = 0;
  in_RDI->disposer = (ArrayDisposer *)0x0;
  return in_RDI;
}

Assistant:

inline Array<PropagateConst<T, byte>> releaseAsBytes() {
    // Like asBytes() but transfers ownership.
    static_assert(sizeof(T) == sizeof(byte),
        "releaseAsBytes() only possible on arrays with byte-size elements (e.g. chars).");
    if (disposer == nullptr) return nullptr;
    Array<PropagateConst<T, byte>> result(
        reinterpret_cast<PropagateConst<T, byte>*>(ptr), size_, *disposer);
    ptr = nullptr;
    size_ = 0;
    return result;
  }